

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-outputs.cc
# Opt level: O0

void runtest_maybe_dobin<std::pair<std::vector<float,std::allocator<float>>,boost::tuples::tuple<std::vector<double,std::allocator<double>>,std::pair<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,std::vector<float,std::allocator<float>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>,true>
               (string *header,
               pair<std::vector<float,_std::allocator<float>_>,_boost::tuples::tuple<std::vector<double,_std::allocator<double>_>,_std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::vector<float,_std::allocator<float>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>
               *arg)

{
  char *pcVar1;
  ostream *poVar2;
  void *this;
  string local_2c8;
  string local_2a8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [8];
  ofstream log_fh;
  pair<std::vector<float,_std::allocator<float>_>,_boost::tuples::tuple<std::vector<double,_std::allocator<double>_>,_std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::vector<float,_std::allocator<float>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>
  *arg_local;
  string *header_local;
  
  std::operator+(&local_278,&basedir_abi_cxx11_,"/");
  std::operator+(&local_258,&local_278,header);
  std::operator+(&local_238,&local_258,"-log.txt");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_218,pcVar1,_S_out);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  poVar2 = std::operator<<((ostream *)local_218,"--- ");
  poVar2 = std::operator<<(poVar2,(string *)header);
  poVar2 = std::operator<<(poVar2," -------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_218,"depth=");
  this = (void *)std::ostream::operator<<(poVar2,1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_218,"ModeAutoDecoder=");
  gnuplotio::Mode1D::class_name_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,local_2a8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::string((string *)&local_2c8,(string *)header);
  runtest_inner<std::pair<std::vector<float,std::allocator<float>>,boost::tuples::tuple<std::vector<double,std::allocator<double>>,std::pair<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,std::vector<float,std::allocator<float>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>,true>
            ((ostream *)local_218,&local_2c8,arg);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void runtest_maybe_dobin(std::string header, const T &arg) {
    std::ofstream log_fh((basedir+"/"+header+"-log.txt").c_str());
    log_fh << "--- " << header << " -------------------------------------" << std::endl;
    log_fh << "depth=" << ArrayTraits<T>::depth << std::endl;
    log_fh << "ModeAutoDecoder=" << ModeAutoDecoder<T>::mode::class_name() << std::endl;
    runtest_inner<T, DoBinary>(log_fh, header, arg);
}